

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O1

void rr::anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)1>
               (RenderState *state,RenderTarget *renderTarget,Program *program,
               VertexPacket **vertices,size_t numVertices,VertexPacketAllocator *vpalloc)

{
  size_type __n;
  vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> inputPrimitives;
  allocator_type local_51;
  vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> local_50;
  Program *local_38;
  
  __n = 0;
  if (2 < numVertices) {
    __n = numVertices - 2;
  }
  local_38 = program;
  std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>::vector(&local_50,__n,&local_51);
  pa::TriangleStrip::
  exec<__gnu_cxx::__normal_iterator<rr::pa::Triangle*,std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>>
            ((__normal_iterator<rr::pa::Triangle_*,_std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>_>
              )local_50.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>.
               _M_impl.super__Vector_impl_data._M_start,vertices,numVertices,
             state->provokingVertexConvention);
  (anonymous_namespace)::
  makeSharedVerticesDistinct<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
            (&local_50,vpalloc);
  (anonymous_namespace)::
  drawBasicPrimitives<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
            (state,renderTarget,local_38,&local_50,vpalloc);
  if (local_50.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
      super__Vector_impl_data._M_start != (Triangle *)0x0) {
    operator_delete(local_50.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void drawGeometryShaderOutputAsPrimitives (const RenderState& state, const RenderTarget& renderTarget, const Program& program, VertexPacket* const* vertices, size_t numVertices, VertexPacketAllocator& vpalloc)
{
	// Run primitive assembly for generated stream

	const size_t															assemblerPrimitiveCount		= PrimitiveTypeTraits<DrawPrimitiveType>::Assembler::getPrimitiveCount(numVertices);
	std::vector<typename PrimitiveTypeTraits<DrawPrimitiveType>::BaseType>	inputPrimitives				(assemblerPrimitiveCount);

	PrimitiveTypeTraits<DrawPrimitiveType>::Assembler::exec(inputPrimitives.begin(), vertices, numVertices, state.provokingVertexConvention); // \note input Primitives are baseType_t => only basic primitives (non adjacency) will compile

	// Make shared vertices distinct

	makeSharedVerticesDistinct(inputPrimitives, vpalloc);

	// Draw assembled primitives

	drawBasicPrimitives(state, renderTarget, program, inputPrimitives, vpalloc);
}